

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void __thiscall
sqlcheck::TestSuite_VariableAttributeTest_Test::TestSuite_VariableAttributeTest_Test
          (TestSuite_VariableAttributeTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001a6440;
  return;
}

Assistant:

TEST(TestSuite, VariableAttributeTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE IssueAttributes ("
      "issue_id    BIGINT UNSIGNED NOT NULL,"
      "attr_name   VARCHAR(100) NOT NULL,"
      "attr_value  VARCHAR(100),"
      "PRIMARY KEY (issue_id, attr_name),"
      "FOREIGN KEY (issue_id) REFERENCES Issues(issue_id)"
      ");"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}